

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::small_vector
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,size_t count,double *value,
          allocator<double> *alloc)

{
  this->m_capacity = 4;
  this->m_dynamic_capacity = 0;
  this->m_dynamic_data = (pointer)0x0;
  this->m_end = (pointer)this->m_static_data;
  this->m_begin = (pointer)this->m_static_data;
  assign_impl(this,count,value);
  return;
}

Assistant:

explicit small_vector(size_t count, const T& value, const Alloc& alloc = Alloc())
        : small_vector(alloc)
    {
        assign_impl(count, value);
    }